

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt_utils.h
# Opt level: O0

void update_coeff_eob_fast
               (int *eob,int shift,int16_t *dequant_ptr,int16_t *scan,tran_low_t *coeff_ptr,
               tran_low_t *qcoeff_ptr,tran_low_t *dqcoeff_ptr)

{
  int iVar1;
  uint uVar2;
  int64_t abs_coeff;
  int coeff_sign;
  int coeff;
  int qcoeff;
  int rc;
  int i;
  int zbin [2];
  int eob_out;
  tran_low_t *qcoeff_ptr_local;
  tran_low_t *coeff_ptr_local;
  int16_t *scan_local;
  int16_t *dequant_ptr_local;
  int shift_local;
  int *eob_local;
  
  eob_out = *eob;
  zbin[0] = (int)*dequant_ptr + (*dequant_ptr * 0x46 + 0x40 >> 7);
  zbin[1] = (int)dequant_ptr[1] + (dequant_ptr[1] * 0x46 + 0x40 >> 7);
  i = *eob;
  while (i = i + -1, -1 < i) {
    iVar1 = (int)scan[i];
    uVar2 = 0;
    if (coeff_ptr[iVar1] < 0) {
      uVar2 = 0xffffffff;
    }
    if (((long)zbin[(int)(uint)(iVar1 != 0)] <=
         (long)(int)((coeff_ptr[iVar1] ^ uVar2) - uVar2) << ((char)shift + 1U & 0x3f)) &&
       (qcoeff_ptr[iVar1] != 0)) break;
    eob_out = eob_out + -1;
    qcoeff_ptr[iVar1] = 0;
    dqcoeff_ptr[iVar1] = 0;
  }
  *eob = eob_out;
  return;
}

Assistant:

static inline void update_coeff_eob_fast(int *eob, int shift,
                                         const int16_t *dequant_ptr,
                                         const int16_t *scan,
                                         const tran_low_t *coeff_ptr,
                                         tran_low_t *qcoeff_ptr,
                                         tran_low_t *dqcoeff_ptr) {
  // TODO(sarahparker) make this work for aomqm
  int eob_out = *eob;
  int zbin[2] = { dequant_ptr[0] + ROUND_POWER_OF_TWO(dequant_ptr[0] * 70, 7),
                  dequant_ptr[1] + ROUND_POWER_OF_TWO(dequant_ptr[1] * 70, 7) };

  for (int i = *eob - 1; i >= 0; i--) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    int64_t abs_coeff = (coeff ^ coeff_sign) - coeff_sign;

    if (((abs_coeff << (1 + shift)) < zbin[rc != 0]) || (qcoeff == 0)) {
      eob_out--;
      qcoeff_ptr[rc] = 0;
      dqcoeff_ptr[rc] = 0;
    } else {
      break;
    }
  }

  *eob = eob_out;
}